

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_glyphslot_grid_fit_metrics(FT_GlyphSlot slot,FT_Bool vertical)

{
  long lVar1;
  long lVar2;
  FT_Glyph_Metrics *pFVar3;
  FT_Pos bottom;
  FT_Pos right;
  FT_Glyph_Metrics *metrics;
  FT_Bool vertical_local;
  FT_GlyphSlot slot_local;
  
  pFVar3 = &slot->metrics;
  if (vertical == '\0') {
    (slot->metrics).vertBearingX = (slot->metrics).vertBearingX & 0xffffffffffffffc0;
    (slot->metrics).vertBearingY = (slot->metrics).vertBearingY & 0xffffffffffffffc0;
    lVar1 = (slot->metrics).horiBearingX;
    lVar2 = (slot->metrics).horiBearingY;
    (slot->metrics).horiBearingX = (slot->metrics).horiBearingX & 0xffffffffffffffc0;
    (slot->metrics).horiBearingY = (slot->metrics).horiBearingY + 0x3fU & 0xffffffffffffffc0;
    pFVar3->width =
         (lVar1 + pFVar3->width + 0x3fU & 0xffffffffffffffc0) - (slot->metrics).horiBearingX;
    (slot->metrics).height =
         (slot->metrics).horiBearingY - (lVar2 - (slot->metrics).height & 0xffffffffffffffc0U);
  }
  else {
    (slot->metrics).horiBearingX = (slot->metrics).horiBearingX & 0xffffffffffffffc0;
    (slot->metrics).horiBearingY = (slot->metrics).horiBearingY + 0x3fU & 0xffffffffffffffc0;
    lVar1 = (slot->metrics).vertBearingX;
    lVar2 = (slot->metrics).vertBearingY;
    (slot->metrics).vertBearingX = (slot->metrics).vertBearingX & 0xffffffffffffffc0;
    (slot->metrics).vertBearingY = (slot->metrics).vertBearingY & 0xffffffffffffffc0;
    pFVar3->width =
         (lVar1 + pFVar3->width + 0x3fU & 0xffffffffffffffc0) - (slot->metrics).vertBearingX;
    (slot->metrics).height =
         (lVar2 + (slot->metrics).height + 0x3fU & 0xffffffffffffffc0) -
         (slot->metrics).vertBearingY;
  }
  (slot->metrics).horiAdvance = (slot->metrics).horiAdvance + 0x20U & 0xffffffffffffffc0;
  (slot->metrics).vertAdvance = (slot->metrics).vertAdvance + 0x20U & 0xffffffffffffffc0;
  return;
}

Assistant:

static void
  ft_glyphslot_grid_fit_metrics( FT_GlyphSlot  slot,
                                 FT_Bool       vertical )
  {
    FT_Glyph_Metrics*  metrics = &slot->metrics;
    FT_Pos             right, bottom;


    if ( vertical )
    {
      metrics->horiBearingX = FT_PIX_FLOOR( metrics->horiBearingX );
      metrics->horiBearingY = FT_PIX_CEIL_LONG( metrics->horiBearingY );

      right  = FT_PIX_CEIL_LONG( ADD_LONG( metrics->vertBearingX,
                                           metrics->width ) );
      bottom = FT_PIX_CEIL_LONG( ADD_LONG( metrics->vertBearingY,
                                           metrics->height ) );

      metrics->vertBearingX = FT_PIX_FLOOR( metrics->vertBearingX );
      metrics->vertBearingY = FT_PIX_FLOOR( metrics->vertBearingY );

      metrics->width  = SUB_LONG( right,
                                  metrics->vertBearingX );
      metrics->height = SUB_LONG( bottom,
                                  metrics->vertBearingY );
    }
    else
    {
      metrics->vertBearingX = FT_PIX_FLOOR( metrics->vertBearingX );
      metrics->vertBearingY = FT_PIX_FLOOR( metrics->vertBearingY );

      right  = FT_PIX_CEIL_LONG( ADD_LONG( metrics->horiBearingX,
                                           metrics->width ) );
      bottom = FT_PIX_FLOOR( SUB_LONG( metrics->horiBearingY,
                                       metrics->height ) );

      metrics->horiBearingX = FT_PIX_FLOOR( metrics->horiBearingX );
      metrics->horiBearingY = FT_PIX_CEIL_LONG( metrics->horiBearingY );

      metrics->width  = SUB_LONG( right,
                                  metrics->horiBearingX );
      metrics->height = SUB_LONG( metrics->horiBearingY,
                                  bottom );
    }

    metrics->horiAdvance = FT_PIX_ROUND_LONG( metrics->horiAdvance );
    metrics->vertAdvance = FT_PIX_ROUND_LONG( metrics->vertAdvance );
  }